

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O1

void AudioBackend_PlaySound(AudioBackend_Sound *sound,BOOL looping)

{
  uchar uVar1;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_lock)(0x12a818);
    }
    sound->playing = true;
    sound->looping = looping;
    uVar1 = 0x80;
    if (looping) {
      uVar1 = *sound->samples;
    }
    sound->samples[sound->frames] = uVar1;
    if (mutex.pContext != (ma_context *)0x0) {
      (*((mutex.pContext)->field_22).posix.pthread_mutex_unlock)(0x12a818);
      return;
    }
  }
  return;
}

Assistant:

void AudioBackend_PlaySound(AudioBackend_Sound *sound, BOOL looping)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	sound->playing = TRUE;
	sound->looping = looping;

	sound->samples[sound->frames] = looping ? sound->samples[0] : 0x80;	// For the linear interpolator

	ma_mutex_unlock(&mutex);
}